

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorShader::ReleaseElementData(DecoratorShader *this,DecoratorDataHandle handle)

{
  PoolNode *pPVar1;
  PoolNode *pPVar2;
  code *pcVar3;
  bool bVar4;
  PoolNode **ppPVar5;
  
  GetShaderElementDataPool();
  GetShaderElementDataPool::gradient_element_data_pool.num_allocated_objects =
       GetShaderElementDataPool::gradient_element_data_pool.num_allocated_objects + -1;
  CompiledShader::Release((CompiledShader *)(handle + 0x10));
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)handle);
  pPVar1 = *(PoolNode **)(handle + 0x20);
  pPVar2 = *(PoolNode **)(handle + 0x28);
  if (pPVar1 == (PoolNode *)0x0) {
    ppPVar5 = &GetShaderElementDataPool::gradient_element_data_pool.first_allocated_node;
    if (GetShaderElementDataPool::gradient_element_data_pool.first_allocated_node !=
        (PoolNode *)handle) {
      bVar4 = Assert("RMLUI_ASSERT(first_allocated_node == object)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Pool.inl"
                     ,0xa5);
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
    }
  }
  else {
    ppPVar5 = &pPVar1->next;
  }
  *ppPVar5 = pPVar2;
  if (pPVar2 != (PoolNode *)0x0) {
    pPVar2->previous = pPVar1;
  }
  *(undefined8 *)(handle + 0x20) = 0;
  *(PoolNode **)(handle + 0x28) =
       GetShaderElementDataPool::gradient_element_data_pool.first_free_node;
  GetShaderElementDataPool::gradient_element_data_pool.first_free_node = (PoolNode *)handle;
  return;
}

Assistant:

void DecoratorShader::ReleaseElementData(DecoratorDataHandle handle) const
{
	ShaderElementData* element_data = reinterpret_cast<ShaderElementData*>(handle);
	GetShaderElementDataPool().DestroyAndDeallocate(element_data);
}